

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int iCol,char *zExpr,Fts5Expr **ppNew,char **pzErr)

{
  byte bVar1;
  fts5yyStackEntry *pfVar2;
  Fts5Parse *pFVar3;
  undefined8 uVar4;
  Fts5ExprNode *pFVar5;
  byte bVar6;
  int iVar7;
  uint extraout_EAX;
  fts5yyParser *fts5yypParser_00;
  Fts5ExprPhrase *pFVar8;
  Fts5ExprNearset *pFVar9;
  Fts5ExprNode *pFVar10;
  long lVar11;
  Fts5Colset *pFVar12;
  Fts5Expr *pFVar13;
  Fts5ExprNode *pFVar14;
  long lVar15;
  byte *pbVar16;
  Fts5ExprNode *pFVar17;
  ushort uVar18;
  uint uVar19;
  fts5YYMINORTYPE *extraout_RDX;
  fts5YYMINORTYPE *extraout_RDX_00;
  uchar *fts5yypminor;
  fts5YYMINORTYPE *extraout_RDX_01;
  fts5YYMINORTYPE *extraout_RDX_02;
  fts5YYMINORTYPE *extraout_RDX_03;
  fts5YYMINORTYPE *fts5yypminor_00;
  fts5YYMINORTYPE *extraout_RDX_04;
  fts5YYMINORTYPE *extraout_RDX_05;
  fts5YYMINORTYPE *extraout_RDX_06;
  fts5yyStackEntry *pfVar20;
  ulong uVar21;
  Fts5Colset *pFVar22;
  Fts5Colset *pFVar23;
  ulong uVar24;
  fts5yyParser *fts5yypParser;
  ulong uVar25;
  bool bVar26;
  Fts5Parse sParse;
  Fts5Parse local_b8;
  Fts5Config *local_88;
  Fts5ExprNode *local_80;
  int local_78;
  uint local_74;
  fts5yyStackEntry *local_70;
  Fts5Colset *local_68;
  Fts5Expr **local_60;
  char **local_58;
  fts5yyParser *local_50;
  ulong local_48;
  Fts5Colset *local_40;
  int local_38;
  
  fts5yypParser_00 = (fts5yyParser *)0x0;
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  local_b8.pExpr = (Fts5ExprNode *)0x0;
  local_b8.rc = 0;
  local_b8.nPhrase = 0;
  local_b8.apPhrase = (Fts5ExprPhrase **)0x0;
  local_b8.pConfig = (Fts5Config *)0x0;
  local_b8.zErr = (char *)0x0;
  local_88 = pConfig;
  local_78 = iCol;
  local_68 = (Fts5Colset *)zExpr;
  local_60 = ppNew;
  local_58 = pzErr;
  iVar7 = sqlite3_initialize();
  fts5yypminor = (uchar *)extraout_RDX;
  if (iVar7 == 0) {
    fts5yypParser_00 = (fts5yyParser *)sqlite3Malloc(0x978);
    fts5yypminor = (uchar *)extraout_RDX_00;
  }
  if (fts5yypParser_00 == (fts5yyParser *)0x0) {
    return 7;
  }
  local_70 = fts5yypParser_00->fts5yystack;
  fts5yypParser_00->fts5yytos = local_70;
  fts5yypParser_00->fts5yystack[0].stateno = '\0';
  fts5yypParser_00->fts5yystack[0].major = '\0';
  fts5yypParser_00->fts5yystackEnd = fts5yypParser_00->fts5yystack + 99;
  local_b8.pConfig = local_88;
  pFVar12 = local_68;
  pFVar22 = local_68;
  local_50 = fts5yypParser_00;
  pfVar20 = local_70;
  do {
    while( true ) {
      bVar6 = (byte)pFVar22->nCol;
      if (0x1f < bVar6) break;
      fts5yypminor = (uchar *)(ulong)(bVar6 - 9);
      if ((1 < bVar6 - 9) && (bVar6 != 0xd)) {
        if (bVar6 == 0) {
          uVar19 = 0;
          goto LAB_001a217c;
        }
        goto switchD_001a2099_caseD_21;
      }
switchD_001a2099_caseD_20:
      pFVar12 = (Fts5Colset *)((long)&pFVar12->nCol + 1);
      pFVar22 = (Fts5Colset *)((long)&pFVar22->nCol + 1);
    }
    if (0x39 < bVar6) {
      if (bVar6 < 0x7b) {
        if (bVar6 == 0x3a) {
          uVar19 = 5;
        }
        else {
          if (bVar6 != 0x5e) goto switchD_001a2099_caseD_21;
          uVar19 = 0xc;
        }
      }
      else if (bVar6 == 0x7b) {
        uVar19 = 7;
      }
      else {
        if (bVar6 != 0x7d) goto switchD_001a2099_caseD_21;
        uVar19 = 8;
      }
      goto LAB_001a217c;
    }
    uVar19 = bVar6 - 0x20;
    if (uVar19 < 0xe) {
      fts5yypminor = (uchar *)((long)&switchD_001a2099::switchdataD_001d78e8 +
                              (long)(int)(&switchD_001a2099::switchdataD_001d78e8)[uVar19]);
      switch((uint)bVar6) {
      case 0x20:
        goto switchD_001a2099_caseD_20;
      default:
        goto switchD_001a2099_caseD_21;
      case 0x22:
        pFVar23 = pFVar22;
        do {
          if (*(char *)((long)&pFVar23->nCol + 1) == '\"') {
            if (*(char *)((long)&pFVar23->nCol + 2) != '\"') {
              uVar24 = (ulong)(((int)pFVar23 - (int)pFVar12) + 2);
              uVar19 = 9;
              goto LAB_001a2182;
            }
            pFVar23 = (Fts5Colset *)((long)&pFVar23->nCol + 2);
          }
          else {
            pFVar23 = (Fts5Colset *)((long)&pFVar23->nCol + 1);
          }
        } while ((char)pFVar23->nCol != '\0');
        sqlite3Fts5ParseError(&local_b8,"unterminated string");
        uVar21 = 0;
        uVar24 = 1;
        fts5yypminor = (uchar *)extraout_RDX_01;
        goto LAB_001a218f;
      case 0x28:
        uVar19 = 10;
        break;
      case 0x29:
        uVar19 = 0xb;
        break;
      case 0x2a:
        uVar19 = 0xf;
        break;
      case 0x2b:
        uVar19 = 0xe;
        break;
      case 0x2c:
        uVar19 = 0xd;
        break;
      case 0x2d:
        uVar19 = 6;
      }
LAB_001a217c:
      uVar24 = 1;
LAB_001a2182:
      local_68 = (Fts5Colset *)((long)pFVar22->aiCol + (long)(int)uVar24 + -4);
      uVar21 = (ulong)uVar19;
    }
    else {
switchD_001a2099_caseD_21:
      if ((char)bVar6 < '\0') {
        bVar26 = false;
      }
      else {
        bVar26 = (&DAT_001dc110)[bVar6] == '\0';
      }
      if (bVar26) {
        sqlite3Fts5ParseError(&local_b8,"fts5: syntax error near \"%.1s\"",pFVar22);
        uVar24 = 1;
        fts5yypminor = (uchar *)extraout_RDX_05;
        uVar19 = extraout_EAX;
      }
      else {
        lVar15 = 0;
        while ((lVar11 = (long)*(char *)((long)pFVar22->aiCol + lVar15 + -3), lVar11 < 0 ||
               (fts5yypminor = &DAT_001dc110, (&DAT_001dc110)[lVar11] != '\0'))) {
          lVar15 = lVar15 + 1;
        }
        uVar19 = 9;
        iVar7 = (int)lVar15;
        if (iVar7 == 1) {
          uVar19 = (uint)((short)pFVar22->nCol != 0x524f) * 8 + 1;
        }
        if ((iVar7 == 2) &&
           (fts5yypminor = (uchar *)0x3,
           *(char *)((long)&pFVar22->nCol + 2) == 'T' && (short)pFVar22->nCol == 0x4f4e)) {
          uVar19 = 3;
        }
        uVar24 = lVar15 + 1;
        if ((iVar7 == 2) &&
           (uVar18 = *(byte *)((long)&pFVar22->nCol + 2) ^ 0x44 | (ushort)pFVar22->nCol ^ 0x4e41,
           fts5yypminor = (uchar *)(ulong)uVar18, uVar18 == 0)) {
          uVar19 = 2;
        }
      }
      uVar21 = 0;
      if (!bVar26) goto LAB_001a2182;
    }
LAB_001a218f:
    fts5yypParser_00->pParse = &local_b8;
    bVar6 = fts5yypParser_00->fts5yytos->stateno;
    local_48 = uVar21 & 0xff;
    local_74 = (uint)local_48;
    do {
      if (bVar6 < 0x23) {
        lVar15 = ",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[bVar6] + local_48;
        if (((uint)lVar15 < 0x79) &&
           (fts5yypminor = 
            "\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
           , "\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
             [lVar15] == (uchar)uVar21)) {
          pbVar16 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                    + lVar15;
        }
        else {
          pbVar16 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP" + bVar6;
        }
        bVar6 = *pbVar16;
      }
      if (bVar6 < 0x53) {
        if (bVar6 < 0x50) {
          pfVar2 = fts5yypParser_00->fts5yytos;
          fts5yypParser_00->fts5yytos = pfVar2 + 1;
          if (fts5yypParser_00->fts5yystackEnd < pfVar2 + 1) {
            fts5yypParser_00->fts5yytos = pfVar2;
            fts5yyStackOverflow(fts5yypParser_00);
            fts5yypminor = (uchar *)extraout_RDX_03;
          }
          else {
            bVar1 = bVar6 + 0x1f;
            if (bVar6 < 0x23) {
              bVar1 = bVar6;
            }
            fts5yypminor = (uchar *)(ulong)bVar1;
            pfVar2[1].stateno = bVar1;
            pfVar2[1].major = (uchar)uVar21;
            pfVar2[1].minor.fts5yy11 = pFVar22;
            pfVar2[1].minor.fts5yy0.n = (int)uVar24;
          }
        }
        else if (bVar6 == 0x51) {
          fts5yypParser_00->fts5yytos = fts5yypParser_00->fts5yytos + -1;
        }
        else {
          pFVar3 = fts5yypParser_00->pParse;
          local_40 = pFVar22;
          local_38 = (int)uVar24;
          sqlite3Fts5ParseError
                    (pFVar3,"fts5: syntax error near \"%.*s\"",uVar24 & 0xffffffff,pFVar22);
          fts5yypParser_00->pParse = pFVar3;
          fts5yy_destructor((fts5yyParser *)(ulong)local_74,(uchar)&local_40,fts5yypminor_00);
          fts5yypminor = (uchar *)extraout_RDX_04;
        }
        break;
      }
      pfVar2 = fts5yypParser_00->fts5yytos;
      uVar25 = (ulong)(bVar6 - 0x53);
      if (0x1b < bVar6 - 0x53) goto switchD_001a2232_caseD_c;
      pFVar3 = fts5yypParser_00->pParse;
      switch(uVar25) {
      case 0:
switchD_001a2232_caseD_0:
        pFVar3->pExpr = (Fts5ExprNode *)(pfVar2->minor).fts5yy0.p;
        break;
      case 1:
switchD_001a2232_caseD_1:
        pFVar8 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar3,pfVar2[-1].minor.fts5yy11);
        goto LAB_001a2463;
      default:
switchD_001a2232_caseD_2:
        pFVar14 = (Fts5ExprNode *)pfVar2[-1].minor.fts5yy0.p;
        goto LAB_001a256f;
      case 3:
      case 6:
switchD_001a2232_caseD_3:
        pFVar14 = (Fts5ExprNode *)
                  sqlite3Fts5ParseColset(pFVar3,(Fts5Colset *)0x0,&(pfVar2->minor).fts5yy0);
        goto LAB_001a2382;
      case 4:
switchD_001a2232_caseD_4:
        pFVar12 = sqlite3Fts5ParseColset(pFVar3,(Fts5Colset *)0x0,&(pfVar2->minor).fts5yy0);
        pfVar2[-1].minor.fts5yy11 = pFVar12;
        pFVar8 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar3,pFVar12);
        goto LAB_001a24a9;
      case 5:
switchD_001a2232_caseD_5:
        pFVar8 = (Fts5ExprPhrase *)
                 sqlite3Fts5ParseColset(pFVar3,pfVar2[-1].minor.fts5yy11,&(pfVar2->minor).fts5yy0);
        goto LAB_001a24a9;
      case 7:
switchD_001a2232_caseD_7:
        pFVar14 = pfVar2[-2].minor.fts5yy24;
        pFVar17 = (pfVar2->minor).fts5yy24;
        iVar7 = 2;
        goto LAB_001a2559;
      case 8:
switchD_001a2232_caseD_8:
        pFVar14 = pfVar2[-2].minor.fts5yy24;
        pFVar17 = (pfVar2->minor).fts5yy24;
        iVar7 = 1;
        goto LAB_001a2559;
      case 9:
switchD_001a2232_caseD_9:
        pFVar14 = pfVar2[-2].minor.fts5yy24;
        pFVar17 = (pfVar2->minor).fts5yy24;
        iVar7 = 3;
LAB_001a2559:
        pFVar14 = sqlite3Fts5ParseNode(pFVar3,iVar7,pFVar14,pFVar17,(Fts5ExprNearset *)0x0);
LAB_001a256f:
        pfVar2[-2].minor.fts5yy0.p = (char *)pFVar14;
        break;
      case 10:
switchD_001a2232_caseD_a:
        sqlite3Fts5ParseSetColset(pFVar3,pfVar2[-1].minor.fts5yy24,pfVar2[-4].minor.fts5yy11);
        pfVar2[-4].minor.fts5yy0.p = pfVar2[-1].minor.fts5yy0.p;
        break;
      case 0xc:
      case 0xd:
        break;
      case 0xe:
switchD_001a2232_caseD_e:
        pFVar14 = pfVar2[-1].minor.fts5yy24;
        pFVar17 = (pfVar2->minor).fts5yy24;
        if (pFVar3->rc == 0) {
          pFVar10 = pFVar14;
          if (pFVar14->eType == 2) {
            pFVar10 = pFVar14->apChild[(long)pFVar14->nChild + -1];
          }
          if (pFVar17->eType == 0) {
            sqlite3Fts5ParseNodeFree(pFVar17);
            pFVar3->nPhrase = pFVar3->nPhrase + -1;
          }
          else if (pFVar10->eType == 0) {
            pFVar5 = pFVar17;
            if (pFVar10 != pFVar14) {
              pFVar14->apChild[(long)pFVar14->nChild + -1] = pFVar17;
              pFVar5 = pFVar14;
            }
            pFVar14 = pFVar5;
            uVar19 = pFVar17->pNear->nPhrase;
            lVar15 = (long)(int)(~uVar19 + pFVar3->nPhrase);
            local_80 = pFVar10;
            memmove(pFVar3->apPhrase + lVar15,pFVar3->apPhrase + lVar15 + 1,(long)(int)uVar19 << 3);
            pFVar3->nPhrase = pFVar3->nPhrase + -1;
            sqlite3Fts5ParseNodeFree(local_80);
            pfVar20 = local_70;
          }
          else {
            pFVar14 = sqlite3Fts5ParseNode(pFVar3,2,pFVar14,pFVar17,(Fts5ExprNearset *)0x0);
          }
        }
        else {
          sqlite3Fts5ParseNodeFree(pFVar14);
          sqlite3Fts5ParseNodeFree(pFVar17);
          pFVar14 = (Fts5ExprNode *)0x0;
        }
        pfVar2[-1].minor.fts5yy0.p = (char *)pFVar14;
        break;
      case 0xf:
switchD_001a2232_caseD_f:
        pFVar14 = sqlite3Fts5ParseNode
                            (pFVar3,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar2->minor).fts5yy46);
        goto LAB_001a2382;
      case 0x10:
switchD_001a2232_caseD_10:
        pFVar14 = sqlite3Fts5ParseNode
                            (pFVar3,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar2->minor).fts5yy46);
        sqlite3Fts5ParseSetColset(pFVar3,pFVar14,pfVar2[-2].minor.fts5yy11);
        pfVar2[-2].minor.fts5yy24 = pFVar14;
        break;
      case 0x11:
      case 0x14:
switchD_001a2232_caseD_11:
        pFVar14 = (Fts5ExprNode *)
                  sqlite3Fts5ParseNearset(pFVar3,(Fts5ExprNearset *)0x0,(pfVar2->minor).fts5yy53);
LAB_001a2382:
        (pfVar2->minor).fts5yy46 = (Fts5ExprNearset *)pFVar14;
        break;
      case 0x12:
switchD_001a2232_caseD_12:
        pFVar8 = (pfVar2->minor).fts5yy53;
        if ((pFVar8 != (Fts5ExprPhrase *)0x0) && (pFVar8->nTerm != 0)) {
          pFVar8->aTerm[0].bFirst = '\x01';
        }
        pFVar9 = sqlite3Fts5ParseNearset(pFVar3,(Fts5ExprNearset *)0x0,(pfVar2->minor).fts5yy53);
        pfVar2[-1].minor.fts5yy46 = pFVar9;
        break;
      case 0x13:
switchD_001a2232_caseD_13:
        uVar19 = pfVar2[-4].minor.fts5yy0.n;
        if ((uVar19 != 4) || ((pfVar2[-4].minor.fts5yy11)->nCol != 0x5241454e)) {
          sqlite3Fts5ParseError
                    (pFVar3,"fts5: syntax error near \"%.*s\"",(ulong)uVar19,
                     pfVar2[-4].minor.fts5yy0.p);
        }
        local_80 = (Fts5ExprNode *)pfVar2[-2].minor.fts5yy11;
        if (local_80 != (Fts5ExprNode *)0x0) {
          iVar7 = pfVar2[-1].minor.fts5yy0.n;
          if (iVar7 == 0) {
            iVar7 = 10;
          }
          else if (iVar7 < 1) {
            iVar7 = 0;
          }
          else {
            lVar15 = 0;
            iVar7 = 0;
            do {
              bVar6 = pfVar2[-1].minor.fts5yy0.p[lVar15];
              if (9 < (byte)(bVar6 - 0x30)) {
                sqlite3Fts5ParseError(pFVar3,"expected integer, got \"%.*s\"");
                fts5yypParser_00 = local_50;
                goto LAB_001a2631;
              }
              iVar7 = (uint)bVar6 + iVar7 * 10 + -0x30;
              lVar15 = lVar15 + 1;
            } while (lVar15 < pfVar2[-1].minor.fts5yy0.n);
          }
          local_80->eType = iVar7;
        }
LAB_001a2631:
        pfVar2[-4].minor.fts5yy0.p = pfVar2[-2].minor.fts5yy0.p;
        pfVar20 = local_70;
        break;
      case 0x15:
switchD_001a2232_caseD_15:
        pFVar8 = (Fts5ExprPhrase *)
                 sqlite3Fts5ParseNearset(pFVar3,pfVar2[-1].minor.fts5yy46,(pfVar2->minor).fts5yy53);
        goto LAB_001a24a9;
      case 0x16:
      case 0x1b:
        if (pfVar2 < fts5yypParser_00->fts5yystackEnd) {
          switch(uVar25) {
          case 0:
            goto switchD_001a2232_caseD_0;
          case 1:
            goto switchD_001a2232_caseD_1;
          case 2:
          case 0xb:
            goto switchD_001a2232_caseD_2;
          case 3:
          case 6:
            goto switchD_001a2232_caseD_3;
          case 4:
            goto switchD_001a2232_caseD_4;
          case 5:
            goto switchD_001a2232_caseD_5;
          case 7:
            goto switchD_001a2232_caseD_7;
          case 8:
            goto switchD_001a2232_caseD_8;
          case 9:
            goto switchD_001a2232_caseD_9;
          case 10:
            goto switchD_001a2232_caseD_a;
          case 0xe:
            goto switchD_001a2232_caseD_e;
          case 0xf:
            goto switchD_001a2232_caseD_f;
          case 0x10:
            goto switchD_001a2232_caseD_10;
          case 0x11:
          case 0x14:
            goto switchD_001a2232_caseD_11;
          case 0x12:
            goto switchD_001a2232_caseD_12;
          case 0x13:
            goto switchD_001a2232_caseD_13;
          case 0x15:
            goto switchD_001a2232_caseD_15;
          case 0x16:
            pfVar2[1].minor.fts5yy0.p = (char *)0x0;
            pfVar2[1].minor.fts5yy0.n = 0;
            break;
          case 0x17:
            goto switchD_001a2232_caseD_17;
          case 0x18:
            goto switchD_001a2232_caseD_18;
          case 0x19:
            goto switchD_001a2232_caseD_19;
          case 0x1a:
            goto switchD_001a2232_caseD_1a;
          case 0x1b:
            pfVar2[1].minor.fts5yyinit = 0;
          }
          break;
        }
        fts5yyStackOverflow(fts5yypParser_00);
        bVar6 = 0;
        fts5yypminor = (uchar *)extraout_RDX_02;
        goto LAB_001a25b6;
      case 0x17:
switchD_001a2232_caseD_17:
        uVar4 = *(undefined8 *)((long)&pfVar2->minor + 8);
        pfVar2[-1].minor.fts5yy0.p = (pfVar2->minor).fts5yy0.p;
        *(undefined8 *)((long)&pfVar2[-1].minor + 8) = uVar4;
        break;
      case 0x18:
switchD_001a2232_caseD_18:
        pFVar8 = sqlite3Fts5ParseTerm
                           (pFVar3,pfVar2[-3].minor.fts5yy53,&pfVar2[-1].minor.fts5yy0,
                            (pfVar2->minor).fts5yyinit);
LAB_001a2463:
        pfVar2[-3].minor.fts5yy53 = pFVar8;
        break;
      case 0x19:
switchD_001a2232_caseD_19:
        pFVar8 = sqlite3Fts5ParseTerm
                           (pFVar3,(Fts5ExprPhrase *)0x0,&pfVar2[-1].minor.fts5yy0,
                            (pfVar2->minor).fts5yyinit);
LAB_001a24a9:
        pfVar2[-1].minor.fts5yy53 = pFVar8;
        break;
      case 0x1a:
switchD_001a2232_caseD_1a:
        (pfVar2->minor).fts5yyinit = 1;
      }
switchD_001a2232_caseD_c:
      bVar1 = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
              [uVar25];
      pfVar2 = pfVar2 + fts5yyRuleInfoNRhs[uVar25];
      fts5yypminor = &pfVar2[1].stateno;
      bVar6 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
              [(long)fts5yy_reduce_ofst[pfVar2->stateno] + (ulong)bVar1];
      fts5yypParser_00->fts5yytos = (fts5yyStackEntry *)fts5yypminor;
      *fts5yypminor = bVar6;
      pfVar2[1].major = bVar1;
LAB_001a25b6:
    } while (pfVar20 < fts5yypParser_00->fts5yytos);
  } while (((int)uVar21 != 0) && (pFVar12 = local_68, pFVar22 = local_68, local_b8.rc == 0));
  while (pfVar2 = fts5yypParser_00->fts5yytos, pfVar20 < pfVar2) {
    fts5yypParser_00->fts5yytos = pfVar2 + -1;
    fts5yy_destructor((fts5yyParser *)(ulong)pfVar2->major,(char)pfVar2 + '\b',
                      (fts5YYMINORTYPE *)fts5yypminor);
    fts5yypminor = (uchar *)extraout_RDX_06;
  }
  sqlite3_free(fts5yypParser_00);
  iVar7 = local_78;
  if ((((local_78 < local_88->nCol) && (local_b8.pExpr != (Fts5ExprNode *)0x0)) &&
      (local_b8.rc == 0)) &&
     (pFVar12 = (Fts5Colset *)sqlite3Fts5MallocZero(&local_b8.rc,8), pFVar12 != (Fts5Colset *)0x0))
  {
    pFVar12->nCol = 1;
    pFVar12->aiCol[0] = iVar7;
    sqlite3Fts5ParseSetColset(&local_b8,local_b8.pExpr,pFVar12);
  }
  if (local_b8.rc == 0) {
    iVar7 = sqlite3_initialize();
    if (iVar7 == 0) {
      pFVar13 = (Fts5Expr *)sqlite3Malloc(0x28);
    }
    else {
      pFVar13 = (Fts5Expr *)0x0;
    }
    *local_60 = pFVar13;
    if (pFVar13 != (Fts5Expr *)0x0) {
      if (local_b8.pExpr == (Fts5ExprNode *)0x0) {
        pFVar14 = (Fts5ExprNode *)sqlite3Fts5MallocZero(&local_b8.rc,0x38);
        pFVar13->pRoot = pFVar14;
        if (pFVar14 != (Fts5ExprNode *)0x0) {
          pFVar14->bEof = 1;
        }
      }
      else {
        pFVar13->pRoot = local_b8.pExpr;
      }
      pFVar13->pIndex = (Fts5Index *)0x0;
      pFVar13->pConfig = local_88;
      pFVar13->apExprPhrase = local_b8.apPhrase;
      pFVar13->nPhrase = local_b8.nPhrase;
      local_b8.apPhrase = (Fts5ExprPhrase **)0x0;
      goto LAB_001a2990;
    }
    local_b8.rc = 7;
  }
  sqlite3Fts5ParseNodeFree(local_b8.pExpr);
LAB_001a2990:
  sqlite3_free(local_b8.apPhrase);
  *local_58 = local_b8.zErr;
  return local_b8.rc;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew, 
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( iCol<pConfig->nCol && sParse.pExpr && sParse.rc==SQLITE_OK ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      if( !sParse.pExpr ){
        const int nByte = sizeof(Fts5ExprNode);
        pNew->pRoot = (Fts5ExprNode*)sqlite3Fts5MallocZero(&sParse.rc, nByte);
        if( pNew->pRoot ){
          pNew->pRoot->bEof = 1;
        }
      }else{
        pNew->pRoot = sParse.pExpr;
      }
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  *pzErr = sParse.zErr;
  return sParse.rc;
}